

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

int lookup_uniforms(MOJOSHADER_glProgram *program,MOJOSHADER_glShader *shader,int *bound)

{
  int size_00;
  _func_int *p_Var1;
  _func_void_MOJOSHADER_glProgram_ptr *p_Var2;
  _func_void_MOJOSHADER_glProgram_ptr_MOJOSHADER_uniform_ptr_GLfloat_ptr *p_Var3;
  _func_GLint_MOJOSHADER_glProgram_ptr_MOJOSHADER_glShader_ptr_int *p_Var4;
  GLint *pGVar5;
  GLfloat *pGVar6;
  MOJOSHADER_uniform *pMVar7;
  int *piVar8;
  MOJOSHADER_glShader *pMVar9;
  int iVar10;
  GLfloat *f_00;
  ulong uVar11;
  MOJOSHADER_parseData *pMVar12;
  undefined1 auStack_b8 [12];
  int local_ac;
  int local_a8;
  int local_a4;
  MOJOSHADER_parseData *local_a0;
  GLint *ptr_2;
  size_t buflen_2;
  GLint *ptr_1;
  size_t buflen_1;
  GLfloat *ptr;
  size_t buflen;
  UniformMap *map;
  int regcount;
  GLint loc;
  GLfloat *f;
  int size;
  int base;
  MOJOSHADER_uniform *u;
  uint local_40;
  int i;
  uint32 bool_count;
  uint32 int4_count;
  uint32 float4_count;
  MOJOSHADER_shaderType shader_type;
  MOJOSHADER_parseData *pd;
  int *bound_local;
  MOJOSHADER_glShader *shader_local;
  MOJOSHADER_glProgram *program_local;
  
  f_00 = (GLfloat *)auStack_b8;
  _float4_count = shader->parseData;
  int4_count = _float4_count->shader_type;
  bool_count = 0;
  i = 0;
  local_40 = 0;
  pd = (MOJOSHADER_parseData *)bound;
  bound_local = (int *)shader;
  shader_local = (MOJOSHADER_glShader *)program;
  for (u._4_4_ = 0; pMVar9 = shader_local, piVar8 = bound_local, iVar10 = u._4_4_,
      u._4_4_ < _float4_count->uniform_count; u._4_4_ = u._4_4_ + 1) {
    _size = _float4_count->uniforms + u._4_4_;
    if (_size->constant == 0) {
      p_Var4 = ctx->profileGetUniformLocation;
      *(undefined8 *)((long)f_00 + -8) = 0x12c6a7;
      map._4_4_ = (*p_Var4)((MOJOSHADER_glProgram *)pMVar9,(MOJOSHADER_glShader *)piVar8,iVar10);
      if (map._4_4_ != 0xffffffff) {
        map._0_4_ = _size->array_count;
        buflen = (size_t)(&(shader_local[2].parseData)->error_count +
                         (ulong)shader_local[1].handle * 6);
        *(uint32 *)buflen = int4_count;
        *(MOJOSHADER_uniform **)(buflen + 8) = _size;
        *(uint32 *)(buflen + 0x10) = map._4_4_;
        shader_local[1].handle = shader_local[1].handle + 1;
        if (_size->type == MOJOSHADER_UNIFORM_FLOAT) {
          local_a4 = (int)map;
          if ((int)map == 0) {
            local_a4 = 1;
          }
          bool_count = local_a4 + bool_count;
        }
        else if (_size->type == MOJOSHADER_UNIFORM_INT) {
          local_a8 = (int)map;
          if ((int)map == 0) {
            local_a8 = 1;
          }
          i = local_a8 + i;
        }
        else {
          if (_size->type != MOJOSHADER_UNIFORM_BOOL) {
            *(undefined8 *)((long)f_00 + -8) = 0x12c7c5;
            __assert_fail("0 && \"Unexpected register type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x6a7,
                          "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)"
                         );
          }
          local_ac = (int)map;
          if ((int)map == 0) {
            local_ac = 1;
          }
          local_40 = local_ac + local_40;
        }
      }
    }
    else {
      p_Var1 = ctx->profileMustPushConstantArrays;
      *(undefined8 *)((long)f_00 + -8) = 0x12c5fa;
      iVar10 = (*p_Var1)();
      pMVar12 = _float4_count;
      if (iVar10 != 0) {
        iVar10 = _size->index;
        size_00 = _size->array_count;
        f_00 = (GLfloat *)((long)f_00 + (long)(size_00 << 2) * -4);
        _regcount = f_00;
        f._0_4_ = size_00;
        f._4_4_ = iVar10;
        f_00[-2] = 1.724163e-39;
        f_00[-1] = 0.0;
        fill_constant_array(f_00,iVar10,size_00,pMVar12);
        pMVar9 = shader_local;
        if (pd->error_count == 0) {
          p_Var2 = ctx->profileUseProgram;
          f_00[-2] = 1.724204e-39;
          f_00[-1] = 0.0;
          (*p_Var2)((MOJOSHADER_glProgram *)pMVar9);
          pd->error_count = 1;
        }
        pMVar9 = shader_local;
        pMVar7 = _size;
        pGVar6 = _regcount;
        p_Var3 = ctx->profilePushConstantArray;
        f_00[-2] = 1.724257e-39;
        f_00[-1] = 0.0;
        (*p_Var3)((MOJOSHADER_glProgram *)pMVar9,pMVar7,pGVar6);
      }
    }
  }
  if (int4_count == 1) {
    for (u._4_4_ = 0; u._4_4_ < _float4_count->sampler_count; u._4_4_ = u._4_4_ + 1) {
      if (_float4_count->samplers[u._4_4_].texbem != 0) {
        bool_count = bool_count + 2;
        shader_local[1].refcount = shader_local[1].refcount + 1;
      }
    }
  }
  if (bool_count != 0) {
    uVar11 = (ulong)bool_count;
    ptr = (GLfloat *)(uVar11 << 4);
    *(undefined8 *)((long)f_00 + -8) = 0x12c852;
    pMVar12 = (MOJOSHADER_parseData *)Malloc((size_t)(uVar11 << 4));
    pGVar6 = ptr;
    if (pMVar12 == (MOJOSHADER_parseData *)0x0) {
      return 0;
    }
    buflen_1 = (size_t)pMVar12;
    if (int4_count == 2) {
      shader_local[4].parseData = pMVar12;
      shader_local[3].handle = (int)(ulong)bool_count;
      shader_local[3].refcount = (int)((ulong)bool_count >> 0x20);
    }
    else {
      if (int4_count != 1) {
        *(undefined8 *)((long)f_00 + -8) = 0x12c8ca;
        __assert_fail("0 && \"unsupported shader type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x6ca,
                      "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)");
      }
      shader_local[7].parseData = pMVar12;
      shader_local[6].handle = (int)(ulong)bool_count;
      shader_local[6].refcount = (int)((ulong)bool_count >> 0x20);
    }
    *(undefined8 *)((long)f_00 + -8) = 0x12c8dd;
    memset(pMVar12,0,(size_t)pGVar6);
  }
  if (i != 0) {
    uVar11 = (ulong)(uint)i;
    ptr_1 = (GLint *)(uVar11 << 4);
    *(undefined8 *)((long)f_00 + -8) = 0x12c8fb;
    pMVar12 = (MOJOSHADER_parseData *)Malloc((size_t)(uVar11 << 4));
    pGVar5 = ptr_1;
    if (pMVar12 == (MOJOSHADER_parseData *)0x0) {
      return 0;
    }
    buflen_2 = (size_t)pMVar12;
    if (int4_count == 2) {
      shader_local[5].parseData = pMVar12;
      shader_local[4].handle = (int)(ulong)(uint)i;
      shader_local[4].refcount = (int)((ulong)(uint)i >> 0x20);
    }
    else {
      if (int4_count != 1) {
        *(undefined8 *)((long)f_00 + -8) = 0x12c982;
        __assert_fail("0 && \"unsupported shader type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x6cb,
                      "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)");
      }
      shader_local[8].parseData = pMVar12;
      shader_local[7].handle = (int)(ulong)(uint)i;
      shader_local[7].refcount = (int)((ulong)(uint)i >> 0x20);
    }
    *(undefined8 *)((long)f_00 + -8) = 0x12c998;
    memset(pMVar12,0,(size_t)pGVar5);
  }
  if (local_40 != 0) {
    uVar11 = (ulong)local_40;
    ptr_2 = (GLint *)(uVar11 << 2);
    *(undefined8 *)((long)f_00 + -8) = 0x12c9bc;
    pMVar12 = (MOJOSHADER_parseData *)Malloc((size_t)(uVar11 << 2));
    pGVar5 = ptr_2;
    if (pMVar12 == (MOJOSHADER_parseData *)0x0) {
      return 0;
    }
    local_a0 = pMVar12;
    if (int4_count == 2) {
      shader_local[6].parseData = pMVar12;
      shader_local[5].handle = (int)(ulong)local_40;
      shader_local[5].refcount = (int)((ulong)local_40 >> 0x20);
    }
    else {
      if (int4_count != 1) {
        *(undefined8 *)((long)f_00 + -8) = 0x12ca46;
        __assert_fail("0 && \"unsupported shader type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x6cc,
                      "int lookup_uniforms(MOJOSHADER_glProgram *, MOJOSHADER_glShader *, int *)");
      }
      shader_local[9].parseData = pMVar12;
      shader_local[8].handle = (int)(ulong)local_40;
      shader_local[8].refcount = (int)((ulong)local_40 >> 0x20);
    }
    *(undefined8 *)((long)f_00 + -8) = 0x12ca5f;
    memset(pMVar12,0,(size_t)pGVar5);
  }
  return 1;
}

Assistant:

static int lookup_uniforms(MOJOSHADER_glProgram *program,
                           MOJOSHADER_glShader *shader, int *bound)
{
    const MOJOSHADER_parseData *pd = shader->parseData;
    const MOJOSHADER_shaderType shader_type = pd->shader_type;
    uint32 float4_count = 0;
    uint32 int4_count = 0;
    uint32 bool_count = 0;
    int i;

    for (i = 0; i < pd->uniform_count; i++)
    {
        const MOJOSHADER_uniform *u = &pd->uniforms[i];

        if (u->constant)
        {
            // only do constants once, at link time. These aren't changed ever.
            if (ctx->profileMustPushConstantArrays())
            {
                const int base = u->index;
                const int size = u->array_count;
                GLfloat *f = (GLfloat *) alloca(sizeof (GLfloat) * (size * 4));
                fill_constant_array(f, base, size, pd);
                if (!(*bound))
                {
                    ctx->profileUseProgram(program);
                    *bound = 1;
                } // if
                ctx->profilePushConstantArray(program, u, f);
            } // if
        } // if

        else
        {
            const GLint loc = ctx->profileGetUniformLocation(program, shader, i);
            if (loc != -1)  // -1 means it was optimized out, or failure.
            {
                const int regcount = u->array_count;
                UniformMap *map = &program->uniforms[program->uniform_count];
                map->shader_type = shader_type;
                map->uniform = u;
                map->location = (GLuint) loc;
                program->uniform_count++;

                if (u->type == MOJOSHADER_UNIFORM_FLOAT)
                    float4_count += regcount ? regcount : 1;
                else if (u->type == MOJOSHADER_UNIFORM_INT)
                    int4_count += regcount ? regcount : 1;
                else if (u->type == MOJOSHADER_UNIFORM_BOOL)
                    bool_count += regcount ? regcount : 1;
                else
                    assert(0 && "Unexpected register type");
            } // if
        } // else
    } // for

    if (shader_type == MOJOSHADER_TYPE_PIXEL)
    {
        for (i = 0; i < pd->sampler_count; i++)
        {
            if (pd->samplers[i].texbem)
            {
                float4_count += 2;
                program->texbem_count++;
            } // if
        } // for
    } // if

    #define MAKE_ARRAY(typ, gltyp, siz, count) \
        if (count) { \
            const size_t buflen = sizeof (gltyp) * siz * count; \
            gltyp *ptr = (gltyp *) Malloc(buflen); \
            if (ptr == NULL) { \
                return 0; \
            } else if (shader_type == MOJOSHADER_TYPE_VERTEX) { \
                program->vs_uniforms_##typ = ptr; \
                program->vs_uniforms_##typ##_count = count; \
            } else if (shader_type == MOJOSHADER_TYPE_PIXEL) { \
                program->ps_uniforms_##typ = ptr; \
                program->ps_uniforms_##typ##_count = count; \
            } else { \
                assert(0 && "unsupported shader type"); \
            } \
            memset(ptr, '\0', buflen); \
        }

    MAKE_ARRAY(float4, GLfloat, 4, float4_count);
    MAKE_ARRAY(int4, GLint, 4, int4_count);
    MAKE_ARRAY(bool, GLint, 1, bool_count);

    #undef MAKE_ARRAY

    return 1;
}